

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecSet.h
# Opt level: O0

void Vec_SetAlloc_(Vec_Set_t *p,int nPageSize)

{
  word **ppwVar1;
  word *pwVar2;
  int nPageSize_local;
  Vec_Set_t *p_local;
  
  if (8 < nPageSize) {
    memset(p,0,0x20);
    p->nPageSize = nPageSize;
    p->uPageMask = (1 << ((byte)nPageSize & 0x1f)) - 1;
    p->nPagesAlloc = 0x100;
    ppwVar1 = (word **)calloc((long)p->nPagesAlloc,8);
    p->pPages = ppwVar1;
    pwVar2 = (word *)malloc((long)(1 << ((byte)p->nPageSize & 0x1f)) << 3);
    *p->pPages = pwVar2;
    **p->pPages = 0xffffffffffffffff;
    (*p->pPages)[1] = 0xffffffffffffffff;
    Vec_SetWriteLimit(*p->pPages,2);
    return;
  }
  __assert_fail("nPageSize > 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecSet.h"
                ,0x75,"void Vec_SetAlloc_(Vec_Set_t *, int)");
}

Assistant:

static inline void Vec_SetAlloc_( Vec_Set_t * p, int nPageSize )
{
    assert( nPageSize > 8 );
    memset( p, 0, sizeof(Vec_Set_t) );
    p->nPageSize    = nPageSize;
    p->uPageMask    = (unsigned)((1 << nPageSize) - 1);
    p->nPagesAlloc  = 256;
    p->pPages       = ABC_CALLOC( word *, p->nPagesAlloc );
    p->pPages[0]    = ABC_ALLOC( word, (1 << p->nPageSize) );
    p->pPages[0][0] = ~0;
    p->pPages[0][1] = ~0;
    Vec_SetWriteLimit( p->pPages[0], 2 );
}